

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O3

void mbedtls_debug_print_ecp
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,
               mbedtls_ecp_point *X)

{
  char str [512];
  char acStack_238 [520];
  
  if (ssl->conf != (mbedtls_ssl_config *)0x0) {
    if ((ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0) &&
       (level <= debug_threshold)) {
      snprintf(acStack_238,0x200,"%s(X)",text);
      mbedtls_debug_print_mpi(ssl,level,file,line,acStack_238,&X->X);
      snprintf(acStack_238,0x200,"%s(Y)",text);
      mbedtls_debug_print_mpi(ssl,level,file,line,acStack_238,&X->Y);
    }
  }
  return;
}

Assistant:

void mbedtls_debug_print_ecp( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line,
                      const char *text, const mbedtls_ecp_point *X )
{
    char str[DEBUG_BUF_SIZE];

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || level > debug_threshold )
        return;

    mbedtls_snprintf( str, sizeof( str ), "%s(X)", text );
    mbedtls_debug_print_mpi( ssl, level, file, line, str, &X->X );

    mbedtls_snprintf( str, sizeof( str ), "%s(Y)", text );
    mbedtls_debug_print_mpi( ssl, level, file, line, str, &X->Y );
}